

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void __thiscall
IR::PropertySymOpnd::Init
          (PropertySymOpnd *this,uint inlineCacheIndex,intptr_t runtimeInlineCache,
          JITTimePolymorphicInlineCache *runtimePolymorphicInlineCache,
          ObjTypeSpecFldInfo *objTypeSpecFldInfo,byte polyCacheUtil)

{
  undefined1 *puVar1;
  
  this->m_inlineCacheIndex = inlineCacheIndex;
  this->m_runtimeInlineCache = runtimeInlineCache;
  this->m_runtimePolymorphicInlineCache = runtimePolymorphicInlineCache;
  this->m_polyCacheUtil = polyCacheUtil;
  SetObjTypeSpecFldInfo(this,objTypeSpecFldInfo);
  puVar1 = &(this->super_SymOpnd).super_Opnd.field_0xb;
  *puVar1 = *puVar1 & 0xf7;
  return;
}

Assistant:

void
PropertySymOpnd::Init(uint inlineCacheIndex, intptr_t runtimeInlineCache, JITTimePolymorphicInlineCache * runtimePolymorphicInlineCache, ObjTypeSpecFldInfo* objTypeSpecFldInfo, byte polyCacheUtil)
{
    this->m_inlineCacheIndex = inlineCacheIndex;
    this->m_runtimeInlineCache = runtimeInlineCache;
    this->m_runtimePolymorphicInlineCache = runtimePolymorphicInlineCache;
    this->m_polyCacheUtil = polyCacheUtil;
    this->SetObjTypeSpecFldInfo(objTypeSpecFldInfo);

    this->SetIsJITOptimizedReg(false);
}